

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::true_matcher>>
          (string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,matcher_wrapper<boost::xpressive::detail::true_matcher> *next)

{
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  char cVar4;
  char *pcVar5;
  matcher_wrapper<boost::xpressive::detail::true_matcher> *extraout_RDX;
  char *pcVar6;
  
  pcVar1 = (state->cur_)._M_current;
  pcVar6 = *(char **)this;
  pcVar5 = pcVar1;
  do {
    pcVar2 = *(char **)(this + 0x20);
    if (pcVar6 == pcVar2) {
LAB_00123c05:
      return pcVar6 == pcVar2;
    }
    if (pcVar5 == (state->end_)._M_current) {
      state->found_partial_match_ = true;
LAB_00123c02:
      (state->cur_)._M_current = pcVar1;
      goto LAB_00123c05;
    }
    plVar3 = *(long **)&(state->context_).traits_[0x21].
                        super_counted_base<boost::xpressive::detail::traits<char>_>;
    cVar4 = (**(code **)(*plVar3 + 0x20))(plVar3,(int)*pcVar5,next);
    if (cVar4 != *pcVar6) goto LAB_00123c02;
    pcVar6 = pcVar6 + 1;
    pcVar5 = (state->cur_)._M_current + 1;
    (state->cur_)._M_current = pcVar5;
    next = extraout_RDX;
  } while( true );
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            BidiIter const tmp = state.cur_;
            char_type const *begin = detail::data_begin(this->str_);
            for(; begin != this->end_; ++begin, ++state.cur_)
            {
                if(state.eos() ||
                    (detail::translate(*state.cur_, traits_cast<Traits>(state), icase_type()) != *begin))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            if(next.match(state))
            {
                return true;
            }

            state.cur_ = tmp;
            return false;
        }